

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImathMatrixAlgo.h
# Opt level: O1

Matrix44<float> *
Imath_2_5::addOffset<float>
          (Matrix44<float> *__return_storage_ptr__,Matrix44<float> *inMat,Vec3<float> *tOffset,
          Vec3<float> *rOffset,Vec3<float> *sOffset,Matrix44<float> *ref)

{
  undefined4 uVar1;
  undefined4 uVar2;
  undefined4 uVar3;
  undefined4 uVar4;
  Matrix44<float> *tmp_2;
  Matrix44<float> tmp;
  Matrix44<float> tmp_1;
  Matrix44<float> O;
  Vec3<float> local_148;
  Matrix44<float> local_138;
  Matrix44<float> local_f8;
  Matrix44<float> local_b8;
  Matrix44<float> local_78;
  
  local_78.x[0][2] = 0.0;
  local_78.x[0][3] = 0.0;
  local_78.x[1][2] = 0.0;
  local_78.x[1][3] = 0.0;
  local_78.x[2][0] = 0.0;
  local_78.x[2][1] = 0.0;
  local_78.x[3][0] = 0.0;
  local_78.x[3][1] = 0.0;
  local_78.x[0][0] = 1.0;
  local_78.x[0][1] = 0.0;
  local_78.x[1][0] = 0.0;
  local_78.x[1][1] = 1.0;
  local_78.x[2][2] = 1.0;
  local_78.x[2][3] = 0.0;
  local_78.x[3][2] = 0.0;
  local_78.x[3][3] = 1.0;
  uVar1 = rOffset->x;
  uVar3 = rOffset->y;
  local_148.x = (float)uVar1 * 0.017453292;
  local_148.y = (float)uVar3 * 0.017453292;
  local_148.z = rOffset->z * 0.017453292;
  Matrix44<float>::rotate<float>(&local_78,&local_148);
  local_78.x[3][0] = tOffset->x;
  local_78.x[3][1] = tOffset->y;
  local_78.x[3][2] = tOffset->z;
  local_b8.x[3][0] = 0.0;
  local_b8.x[3][1] = 0.0;
  local_b8.x[3][2] = 0.0;
  local_b8.x[3][3] = 1.0;
  uVar2 = sOffset->x;
  uVar4 = sOffset->y;
  local_b8.x[0][1] = (float)uVar2 * 0.0;
  local_b8.x[0][0] = (float)uVar2;
  local_b8.x[0][3] = (float)uVar2 * 0.0;
  local_b8.x[0][2] = (float)uVar2 * 0.0;
  local_b8.x[1][1] = (float)uVar4;
  local_b8.x[1][0] = (float)uVar4 * 0.0;
  local_b8.x[2][2] = sOffset->z;
  local_b8.x[1][3] = (float)uVar4 * 0.0;
  local_b8.x[1][2] = (float)uVar4 * 0.0;
  local_b8.x[2][1] = local_b8.x[2][2] * 0.0;
  local_b8.x[2][0] = local_b8.x[2][2] * 0.0;
  local_b8.x[2][3] = local_b8.x[2][2] * 0.0;
  local_138.x[3][0] = 0.0;
  local_138.x[3][1] = 0.0;
  local_138.x[3][2] = 0.0;
  local_138.x[3][3] = 0.0;
  local_138.x[2][0] = 0.0;
  local_138.x[2][1] = 0.0;
  local_138.x[2][2] = 0.0;
  local_138.x[2][3] = 0.0;
  local_138.x[1][0] = 0.0;
  local_138.x[1][1] = 0.0;
  local_138.x[1][2] = 0.0;
  local_138.x[1][3] = 0.0;
  local_138.x[0][0] = 0.0;
  local_138.x[0][1] = 0.0;
  local_138.x[0][2] = 0.0;
  local_138.x[0][3] = 0.0;
  Matrix44<float>::multiply(&local_b8,&local_78,&local_138);
  local_f8.x[3][0] = 0.0;
  local_f8.x[3][1] = 0.0;
  local_f8.x[3][2] = 0.0;
  local_f8.x[3][3] = 0.0;
  local_f8.x[2][0] = 0.0;
  local_f8.x[2][1] = 0.0;
  local_f8.x[2][2] = 0.0;
  local_f8.x[2][3] = 0.0;
  local_f8.x[1][0] = 0.0;
  local_f8.x[1][1] = 0.0;
  local_f8.x[1][2] = 0.0;
  local_f8.x[1][3] = 0.0;
  local_f8.x[0][0] = 0.0;
  local_f8.x[0][1] = 0.0;
  local_f8.x[0][2] = 0.0;
  local_f8.x[0][3] = 0.0;
  Matrix44<float>::multiply(&local_138,inMat,&local_f8);
  *(float *)((long)(__return_storage_ptr__->x + 3) + 0) = 0.0;
  *(float *)((long)(__return_storage_ptr__->x + 3) + 4) = 0.0;
  *(float *)((long)(__return_storage_ptr__->x + 3) + 8) = 0.0;
  *(float *)((long)(__return_storage_ptr__->x + 3) + 0xc) = 0.0;
  *(float *)((long)(__return_storage_ptr__->x + 2) + 0) = 0.0;
  *(float *)((long)(__return_storage_ptr__->x + 2) + 4) = 0.0;
  *(float *)((long)(__return_storage_ptr__->x + 2) + 8) = 0.0;
  *(float *)((long)(__return_storage_ptr__->x + 2) + 0xc) = 0.0;
  *(float *)((long)(__return_storage_ptr__->x + 1) + 0) = 0.0;
  *(float *)((long)(__return_storage_ptr__->x + 1) + 4) = 0.0;
  *(float *)((long)(__return_storage_ptr__->x + 1) + 8) = 0.0;
  *(float *)((long)(__return_storage_ptr__->x + 1) + 0xc) = 0.0;
  *(float *)((long)(__return_storage_ptr__->x + 0) + 0) = 0.0;
  *(float *)((long)(__return_storage_ptr__->x + 0) + 4) = 0.0;
  *(float *)((long)(__return_storage_ptr__->x + 0) + 8) = 0.0;
  *(float *)((long)(__return_storage_ptr__->x + 0) + 0xc) = 0.0;
  Matrix44<float>::multiply(&local_f8,ref,__return_storage_ptr__);
  return __return_storage_ptr__;
}

Assistant:

Matrix44<T>
addOffset( const Matrix44<T>& inMat,
           const Vec3<T>&     tOffset,
           const Vec3<T>&     rOffset,
           const Vec3<T>&     sOffset,
           const Matrix44<T>& ref)
{
    Matrix44<T> O;

    Vec3<T> _rOffset(rOffset);
    _rOffset *= M_PI / 180.0;
    O.rotate (_rOffset);

    O[3][0] = tOffset[0];
    O[3][1] = tOffset[1];
    O[3][2] = tOffset[2];

    Matrix44<T> S;
    S.scale (sOffset);

    Matrix44<T> X = S * O * inMat * ref;

    return X;
}